

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

optional<bound_token> *
read_bound(optional<bound_token> *__return_storage_ptr__,string_view_array *tokens)

{
  string_view buf_3;
  string_view buf_3_00;
  string_view name_;
  string_view buf_2;
  string_view buf_1;
  string_view buf_2_00;
  string_view buf_1_00;
  string_view str;
  string_view buf_1_01;
  string_view buf_2_01;
  string_view buf_3_01;
  string_view buf_4;
  string_view buf;
  string_view str_00;
  string_view name__00;
  string_view buf_4_00;
  string_view name__01;
  string_view str_01;
  string_view buf_00;
  string_view str_02;
  string_view buf_4_01;
  string_view name__02;
  undefined4 uVar1;
  bool bVar2;
  const_reference pvVar3;
  sub_bound_token *psVar4;
  basic_string_view<char,_std::char_traits<char>_> *pbVar5;
  double dVar6;
  double dVar7;
  bound_token local_2a0;
  size_t local_278;
  char *local_270;
  bound_token local_268;
  size_t local_238;
  char *local_230;
  size_t local_228;
  char *local_220;
  size_t local_218;
  char *local_210;
  size_t local_208;
  char *local_200;
  undefined1 local_1f8 [8];
  optional<sub_bound_token> right_opt_1;
  undefined1 local_1b8 [8];
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> name_opt_1;
  bound_token local_180;
  size_t local_150;
  char *local_148;
  size_t local_140;
  char *local_138;
  size_t local_130;
  char *local_128;
  size_t local_120;
  char *local_118;
  undefined1 local_110 [8];
  optional<sub_bound_token> right_opt;
  bound_token local_e8;
  size_t local_c0;
  char *local_b8;
  size_t local_a8;
  char *local_a0;
  undefined1 local_98 [8];
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> name_opt;
  int read;
  undefined1 local_38 [8];
  optional<sub_bound_token> left_opt;
  string_view_array *tokens_local;
  
  pvVar3 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_10UL>::operator[]
                     (tokens,0);
  left_opt.super__Optional_base<sub_bound_token,_true,_true>._M_payload.
  super__Optional_payload_base<sub_bound_token>._16_8_ = pvVar3->_M_len;
  str._M_len = pvVar3->_M_len;
  str._M_str = pvVar3->_M_str;
  bVar2 = starts_with_number(str);
  if (bVar2) {
    pvVar3 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_10UL>::operator[]
                       (tokens,0);
    buf_1_01._M_len = pvVar3->_M_len;
    buf_1_01._M_str = pvVar3->_M_str;
    pvVar3 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_10UL>::operator[]
                       (tokens,1);
    buf_2_01._M_len = pvVar3->_M_len;
    buf_2_01._M_str = pvVar3->_M_str;
    pvVar3 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_10UL>::operator[]
                       (tokens,2);
    buf_3_01._M_len = pvVar3->_M_len;
    buf_3_01._M_str = pvVar3->_M_str;
    pvVar3 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_10UL>::operator[]
                       (tokens,3);
    buf_4._M_len = pvVar3->_M_len;
    buf_4._M_str = pvVar3->_M_str;
    read_left_bound_token((optional<sub_bound_token> *)local_38,buf_1_01,buf_2_01,buf_3_01,buf_4);
    bVar2 = std::optional::operator_cast_to_bool((optional *)local_38);
    if (bVar2) {
      psVar4 = std::optional<sub_bound_token>::operator->((optional<sub_bound_token> *)local_38);
      name_opt.
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._16_4_ =
           psVar4->read;
      pvVar3 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_10UL>::operator[]
                         (tokens,(long)(int)name_opt.
                                            super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                                            ._M_payload.
                                            super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                                            ._16_4_);
      local_a8 = pvVar3->_M_len;
      local_a0 = pvVar3->_M_str;
      buf._M_len = pvVar3->_M_len;
      buf._M_str = pvVar3->_M_str;
      read_name((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)local_98,buf);
      bVar2 = std::optional::operator_cast_to_bool((optional *)local_98);
      if (bVar2) {
        name_opt.
        super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._16_4_
             = name_opt.
               super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
               _16_4_ + 1;
        pvVar3 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_10UL>::operator[]
                           (tokens,(long)(int)name_opt.
                                              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                                              ._M_payload.
                                              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                                              ._16_4_);
        local_c0 = pvVar3->_M_len;
        local_b8 = pvVar3->_M_str;
        str_00._M_len = pvVar3->_M_len;
        str_00._M_str = pvVar3->_M_str;
        bVar2 = starts_with_operator(str_00);
        if (bVar2) {
          pvVar3 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_10UL>::
                   operator[](tokens,(long)(int)name_opt.
                                                super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                                                ._M_payload.
                                                super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                                                ._16_4_);
          local_120 = pvVar3->_M_len;
          local_118 = pvVar3->_M_str;
          pvVar3 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_10UL>::
                   operator[](tokens,(long)(name_opt.
                                            super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                                            ._M_payload.
                                            super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                                            ._16_4_ + 1));
          local_130 = pvVar3->_M_len;
          local_128 = pvVar3->_M_str;
          pvVar3 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_10UL>::
                   operator[](tokens,(long)(name_opt.
                                            super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                                            ._M_payload.
                                            super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                                            ._16_4_ + 2));
          local_140 = pvVar3->_M_len;
          local_138 = pvVar3->_M_str;
          pvVar3 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_10UL>::
                   operator[](tokens,(long)(name_opt.
                                            super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                                            ._M_payload.
                                            super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                                            ._16_4_ + 3));
          local_150 = pvVar3->_M_len;
          local_148 = pvVar3->_M_str;
          buf_4_00._M_len = pvVar3->_M_len;
          buf_4_00._M_str = pvVar3->_M_str;
          buf_1_00._M_str = local_118;
          buf_1_00._M_len = local_120;
          buf_2_00._M_str = local_128;
          buf_2_00._M_len = local_130;
          buf_3._M_str = local_138;
          buf_3._M_len = local_140;
          read_right_bound_token
                    ((optional<sub_bound_token> *)local_110,buf_1_00,buf_2_00,buf_3,buf_4_00);
          bVar2 = std::optional::operator_cast_to_bool((optional *)local_110);
          if (bVar2) {
            psVar4 = std::optional<sub_bound_token>::operator->
                               ((optional<sub_bound_token> *)local_38);
            dVar6 = psVar4->value;
            psVar4 = std::optional<sub_bound_token>::operator->
                               ((optional<sub_bound_token> *)local_110);
            if (dVar6 <= psVar4->value) {
              psVar4 = std::optional<sub_bound_token>::operator->
                                 ((optional<sub_bound_token> *)local_38);
              dVar6 = psVar4->value;
              psVar4 = std::optional<sub_bound_token>::operator->
                                 ((optional<sub_bound_token> *)local_110);
              dVar7 = psVar4->value;
              pbVar5 = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::
                       operator*((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *
                                 )local_98);
              uVar1 = name_opt.
                      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                      ._16_4_;
              name__01._M_len = pbVar5->_M_len;
              name__01._M_str = pbVar5->_M_str;
              psVar4 = std::optional<sub_bound_token>::operator->
                                 ((optional<sub_bound_token> *)local_110);
              bound_token::bound_token(&local_180,dVar6,dVar7,name__01,uVar1 + psVar4->read);
              std::optional<bound_token>::optional<bound_token,_true>
                        (__return_storage_ptr__,&local_180);
            }
            else {
              std::optional<bound_token>::optional(__return_storage_ptr__);
            }
          }
          else {
            std::optional<bound_token>::optional(__return_storage_ptr__);
          }
        }
        else {
          psVar4 = std::optional<sub_bound_token>::operator->((optional<sub_bound_token> *)local_38)
          ;
          dVar6 = psVar4->value;
          dVar7 = std::numeric_limits<double>::infinity();
          pbVar5 = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::operator*
                             ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                              local_98);
          right_opt.super__Optional_base<sub_bound_token,_true,_true>._M_payload.
          super__Optional_payload_base<sub_bound_token>._16_8_ = pbVar5->_M_len;
          name__00._M_len = pbVar5->_M_len;
          name__00._M_str = pbVar5->_M_str;
          bound_token::bound_token
                    (&local_e8,dVar6,dVar7,name__00,
                     name_opt.
                     super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                     ._16_4_ + 1);
          std::optional<bound_token>::optional<bound_token,_true>(__return_storage_ptr__,&local_e8);
        }
      }
      else {
        std::optional<bound_token>::optional(__return_storage_ptr__);
      }
    }
    else {
      std::optional<bound_token>::optional(__return_storage_ptr__);
    }
  }
  else {
    pvVar3 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_10UL>::operator[]
                       (tokens,0);
    name_opt_1.
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _16_8_ = pvVar3->_M_len;
    str_01._M_len = pvVar3->_M_len;
    str_01._M_str = pvVar3->_M_str;
    bVar2 = starts_with_name(str_01);
    if (bVar2) {
      pvVar3 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_10UL>::operator[]
                         (tokens,0);
      buf_00._M_len = pvVar3->_M_len;
      buf_00._M_str = pvVar3->_M_str;
      read_name((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)local_1b8,buf_00
               );
      bVar2 = std::optional::operator_cast_to_bool((optional *)local_1b8);
      if (bVar2) {
        pvVar3 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_10UL>::operator[]
                           (tokens,1);
        right_opt_1.super__Optional_base<sub_bound_token,_true,_true>._M_payload.
        super__Optional_payload_base<sub_bound_token>._16_8_ = pvVar3->_M_len;
        str_02._M_len = pvVar3->_M_len;
        str_02._M_str = pvVar3->_M_str;
        bVar2 = starts_with_operator(str_02);
        if (bVar2) {
          pvVar3 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_10UL>::
                   operator[](tokens,1);
          local_208 = pvVar3->_M_len;
          local_200 = pvVar3->_M_str;
          pvVar3 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_10UL>::
                   operator[](tokens,2);
          local_218 = pvVar3->_M_len;
          local_210 = pvVar3->_M_str;
          pvVar3 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_10UL>::
                   operator[](tokens,3);
          local_228 = pvVar3->_M_len;
          local_220 = pvVar3->_M_str;
          pvVar3 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_10UL>::
                   operator[](tokens,4);
          local_238 = pvVar3->_M_len;
          local_230 = pvVar3->_M_str;
          buf_4_01._M_len = pvVar3->_M_len;
          buf_4_01._M_str = pvVar3->_M_str;
          buf_1._M_str = local_200;
          buf_1._M_len = local_208;
          buf_2._M_str = local_210;
          buf_2._M_len = local_218;
          buf_3_00._M_str = local_220;
          buf_3_00._M_len = local_228;
          read_right_bound_token
                    ((optional<sub_bound_token> *)local_1f8,buf_1,buf_2,buf_3_00,buf_4_01);
          bVar2 = std::optional::operator_cast_to_bool((optional *)local_1f8);
          if (bVar2) {
            psVar4 = std::optional<sub_bound_token>::operator->
                               ((optional<sub_bound_token> *)local_1f8);
            dVar6 = psVar4->value;
            pbVar5 = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::
                     operator*((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                               local_1b8);
            local_278 = pbVar5->_M_len;
            local_270 = pbVar5->_M_str;
            psVar4 = std::optional<sub_bound_token>::operator->
                               ((optional<sub_bound_token> *)local_1f8);
            name_._M_str = local_270;
            name_._M_len = local_278;
            bound_token::bound_token(&local_268,0.0,dVar6,name_,psVar4->read + 1);
            std::optional<bound_token>::optional<bound_token,_true>
                      (__return_storage_ptr__,&local_268);
          }
          else {
            std::optional<bound_token>::optional(__return_storage_ptr__);
          }
        }
        else {
          dVar6 = std::numeric_limits<double>::infinity();
          dVar7 = std::numeric_limits<double>::infinity();
          pbVar5 = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::operator*
                             ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                              local_1b8);
          name__02._M_len = pbVar5->_M_len;
          name__02._M_str = pbVar5->_M_str;
          bound_token::bound_token(&local_2a0,-dVar6,dVar7,name__02,1);
          std::optional<bound_token>::optional<bound_token,_true>(__return_storage_ptr__,&local_2a0)
          ;
        }
      }
      else {
        std::optional<bound_token>::optional(__return_storage_ptr__);
      }
    }
    else {
      std::optional<bound_token>::optional(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<bound_token>
read_bound(const stream_buffer::string_view_array& tokens) noexcept
{
    if (starts_with_number(tokens[0])) {
        auto left_opt =
          read_left_bound_token(tokens[0], tokens[1], tokens[2], tokens[3]);
        if (!left_opt)
            return std::nullopt;

        int read = left_opt->read;

        auto name_opt = read_name(tokens[read]);
        if (!name_opt)
            return std::nullopt;

        ++read;

        if (!starts_with_operator(tokens[read]))
            return bound_token(left_opt->value,
                               std::numeric_limits<double>::infinity(),
                               *name_opt,
                               read + 1);

        auto right_opt = read_right_bound_token(
          tokens[read], tokens[read + 1], tokens[read + 2], tokens[read + 3]);
        if (!right_opt)
            return std::nullopt;

        if (left_opt->value > right_opt->value)
            return std::nullopt;

        return bound_token(left_opt->value,
                           right_opt->value,
                           *name_opt,
                           read + right_opt->read);
    }

    if (starts_with_name(tokens[0])) {
        auto name_opt = read_name(tokens[0]);
        if (!name_opt)
            return std::nullopt;

        if (starts_with_operator(tokens[1])) {
            auto right_opt = read_right_bound_token(
              tokens[1], tokens[2], tokens[3], tokens[4]);
            if (!right_opt)
                return std::nullopt;

            return bound_token(
              0.0, right_opt->value, *name_opt, 1 + right_opt->read);
        }

        return bound_token(-std::numeric_limits<double>::infinity(),
                           +std::numeric_limits<double>::infinity(),
                           *name_opt,
                           1);
    }

    return std::nullopt;
}